

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

int Ssw_SmlNodeCountOnesReal(Ssw_Sml_t *p,Aig_Obj_t *pObj)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = p->nWordsTotal;
  lVar1 = (long)(int)(*(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x24) * uVar2) * 4;
  if ((((uint)pObj ^ *(uint *)(((ulong)pObj & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
    if (0 < (int)uVar2) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        uVar3 = *(uint *)((long)&p[1].pAig + uVar5 * 4 + lVar1);
        uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar4 = (uVar3 >> 0x10) + iVar4 + (uVar3 & 0xffff);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      return iVar4;
    }
  }
  else if (0 < (int)uVar2) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      uVar3 = ~*(uint *)((long)&p[1].pAig + uVar5 * 4 + lVar1);
      uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
      uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
      uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
      iVar4 = (uVar3 >> 0x10) + iVar4 + (uVar3 & 0xffff);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    return iVar4;
  }
  return 0;
}

Assistant:

int Ssw_SmlNodeCountOnesReal( Ssw_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, Counter = 0;
    pSims = Ssw_ObjSim(p, Aig_Regular(pObj)->Id);
    if ( Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) )
    {
        for ( i = 0; i < p->nWordsTotal; i++ )
            Counter += Aig_WordCountOnes( ~pSims[i] );
    }
    else
    {
        for ( i = 0; i < p->nWordsTotal; i++ )
            Counter += Aig_WordCountOnes( pSims[i] );
    }
    return Counter;
}